

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_uuid.cpp
# Opt level: O2

ON_wString ON_RemoveIdSuffixFromString(wchar_t *source,wchar_t *separator,ON_UUID id)

{
  ON_Locale *locale;
  ON_wString suffix;
  ON_wString local_30;
  ON_wString s;
  
  ON_wString::ON_wString(&s,separator);
  ON_wString::ON_wString(&suffix,id._0_8_);
  ON_IdToString(_suffix);
  ON_wString::operator+=(&suffix,&local_30);
  ON_wString::~ON_wString(&local_30);
  locale = (ON_Locale *)ON_wString::operator_cast_to_wchar_t_(&suffix);
  ON_wString::RemoveSuffix((ON_wString *)source,(wchar_t *)&s,locale,true);
  ON_wString::~ON_wString(&suffix);
  ON_wString::~ON_wString(&s);
  return (ON_wString)source;
}

Assistant:

ON_DECL
const ON_wString ON_RemoveIdSuffixFromString(
  const wchar_t* source,
  const wchar_t* separator,
  const ON_UUID id
)
{
  ON_wString s(source);
  ON_wString suffix(separator);
  suffix += ON_IdToString(id);
  return s.RemoveSuffix(suffix,ON_Locale::Ordinal,true);
}